

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcCollapse.c
# Opt level: O0

Abc_Ntk_t * Abc_NtkFromGlobalBdds(Abc_Ntk_t *pNtk,int fReverse)

{
  FILE *pFile;
  int iVar1;
  DdManager *ddDestination;
  void *pvVar2;
  DdManager *ddSource;
  Abc_Obj_t *pAVar3;
  DdNode *pDVar4;
  DdNode *pDVar5;
  DdNode *n;
  DdNode *n_00;
  Abc_Ntk_t *pNtkNew_00;
  ProgressBar *p;
  Abc_Obj_t *pAVar6;
  char *__s1;
  char *__s2;
  DdNode *bBddU;
  DdNode *bBddL;
  DdNode *bBddDc;
  DdNode *bBddMin;
  DdManager *ddExdc;
  int i;
  DdManager *dd;
  Abc_Obj_t *pNodeNew;
  Abc_Obj_t *pDriver;
  Abc_Obj_t *pNode;
  Abc_Ntk_t *pNtkNew;
  ProgressBar *pProgress;
  int fReverse_local;
  Abc_Ntk_t *pNtk_local;
  
  ddDestination = (DdManager *)Abc_NtkGlobalBddMan(pNtk);
  if (pNtk->pExdc != (Abc_Ntk_t *)0x0) {
    iVar1 = Abc_NtkIsStrash(pNtk->pExdc);
    if (iVar1 == 0) {
      __assert_fail("Abc_NtkIsStrash(pNtk->pExdc)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcCollapse.c"
                    ,0x93,"Abc_Ntk_t *Abc_NtkFromGlobalBdds(Abc_Ntk_t *, int)");
    }
    iVar1 = Abc_NtkCoNum(pNtk->pExdc);
    if (iVar1 != 1) {
      __assert_fail("Abc_NtkCoNum(pNtk->pExdc) == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcCollapse.c"
                    ,0x94,"Abc_Ntk_t *Abc_NtkFromGlobalBdds(Abc_Ntk_t *, int)");
    }
    pvVar2 = Abc_NtkBuildGlobalBdds(pNtk->pExdc,10000000,1,1,0,0);
    if (pvVar2 == (void *)0x0) {
      return (Abc_Ntk_t *)0x0;
    }
    ddSource = (DdManager *)Abc_NtkGlobalBddMan(pNtk->pExdc);
    pAVar3 = Abc_NtkCo(pNtk->pExdc,0);
    pDVar4 = (DdNode *)Abc_ObjGlobalBdd(pAVar3);
    pDVar4 = Cudd_bddTransfer(ddSource,ddDestination,pDVar4);
    Cudd_Ref(pDVar4);
    Abc_NtkFreeGlobalBdds(pNtk->pExdc,1);
    for (ddExdc._4_4_ = 0; iVar1 = Abc_NtkCoNum(pNtk), ddExdc._4_4_ < iVar1;
        ddExdc._4_4_ = ddExdc._4_4_ + 1) {
      pAVar3 = Abc_NtkCo(pNtk,ddExdc._4_4_);
      pDVar5 = (DdNode *)Abc_ObjGlobalBdd(pAVar3);
      n = Cudd_bddAnd(ddDestination,pDVar5,(DdNode *)((ulong)pDVar4 ^ 1));
      Cudd_Ref(n);
      n_00 = Cudd_bddAnd(ddDestination,(DdNode *)((ulong)pDVar5 ^ 1),(DdNode *)((ulong)pDVar4 ^ 1));
      Cudd_Ref(n_00);
      Cudd_RecursiveDeref(ddDestination,pDVar5);
      pDVar5 = Cudd_bddIsop(ddDestination,n,(DdNode *)((ulong)n_00 ^ 1));
      Cudd_Ref(pDVar5);
      Cudd_RecursiveDeref(ddDestination,n);
      Cudd_RecursiveDeref(ddDestination,n_00);
      Abc_ObjSetGlobalBdd(pAVar3,pDVar5);
    }
    Cudd_RecursiveDeref(ddDestination,pDVar4);
  }
  pNtkNew_00 = Abc_NtkStartFrom(pNtk,ABC_NTK_LOGIC,ABC_FUNC_BDD);
  Cudd_bddIthVar((DdManager *)pNtkNew_00->pManFunc,ddDestination->size + -1);
  pFile = _stdout;
  iVar1 = Abc_NtkCoNum(pNtk);
  p = Extra_ProgressBarStart(pFile,iVar1);
  ddExdc._4_4_ = 0;
  do {
    iVar1 = Abc_NtkCoNum(pNtk);
    if (iVar1 <= ddExdc._4_4_) {
      Extra_ProgressBarStop(p);
      return pNtkNew_00;
    }
    pAVar3 = Abc_NtkCo(pNtk,ddExdc._4_4_);
    Extra_ProgressBarUpdate(p,ddExdc._4_4_,(char *)0x0);
    pAVar6 = Abc_ObjFanin0(pAVar3);
    iVar1 = Abc_ObjIsCi(pAVar6);
    if (iVar1 == 0) {
LAB_002db73a:
      pDVar4 = (DdNode *)Abc_ObjGlobalBdd(pAVar3);
      pAVar6 = Abc_NodeFromGlobalBdds(pNtkNew_00,ddDestination,pDVar4,fReverse);
      Abc_ObjAddFanin((pAVar3->field_6).pCopy,pAVar6);
    }
    else {
      __s1 = Abc_ObjName(pAVar3);
      __s2 = Abc_ObjName(pAVar6);
      iVar1 = strcmp(__s1,__s2);
      if (iVar1 != 0) goto LAB_002db73a;
      Abc_ObjAddFanin((pAVar3->field_6).pCopy,(pAVar6->field_6).pCopy);
    }
    ddExdc._4_4_ = ddExdc._4_4_ + 1;
  } while( true );
}

Assistant:

Abc_Ntk_t * Abc_NtkFromGlobalBdds( Abc_Ntk_t * pNtk, int fReverse )
{
    ProgressBar * pProgress;
    Abc_Ntk_t * pNtkNew;
    Abc_Obj_t * pNode, * pDriver, * pNodeNew;
    DdManager * dd = (DdManager *)Abc_NtkGlobalBddMan( pNtk );
    int i;

    // extract don't-care and compute ISOP
    if ( pNtk->pExdc )
    {
        DdManager * ddExdc = NULL;
        DdNode * bBddMin, * bBddDc, * bBddL, * bBddU;
        assert( Abc_NtkIsStrash(pNtk->pExdc) );
        assert( Abc_NtkCoNum(pNtk->pExdc) == 1 );
        // compute the global BDDs
        if ( Abc_NtkBuildGlobalBdds(pNtk->pExdc, 10000000, 1, 1, 0, 0) == NULL )
            return NULL;
        // transfer tot the same manager
        ddExdc = (DdManager *)Abc_NtkGlobalBddMan( pNtk->pExdc );
        bBddDc = (DdNode *)Abc_ObjGlobalBdd(Abc_NtkCo(pNtk->pExdc, 0));
        bBddDc = Cudd_bddTransfer( ddExdc, dd, bBddDc );  Cudd_Ref( bBddDc );
        Abc_NtkFreeGlobalBdds( pNtk->pExdc, 1 );
        // minimize the output
        Abc_NtkForEachCo( pNtk, pNode, i )
        {
            bBddMin = (DdNode *)Abc_ObjGlobalBdd(pNode);
            // derive lower and uppwer bound
            bBddL = Cudd_bddAnd( dd, bBddMin,           Cudd_Not(bBddDc) );  Cudd_Ref( bBddL );
            bBddU = Cudd_bddAnd( dd, Cudd_Not(bBddMin), Cudd_Not(bBddDc) );  Cudd_Ref( bBddU );
            Cudd_RecursiveDeref( dd, bBddMin );
            // compute new one
            bBddMin = Cudd_bddIsop( dd, bBddL, Cudd_Not(bBddU) );            Cudd_Ref( bBddMin );
            Cudd_RecursiveDeref( dd, bBddL );
            Cudd_RecursiveDeref( dd, bBddU );
            // update global BDD
            Abc_ObjSetGlobalBdd( pNode, bBddMin );
            //Extra_bddPrint( dd, bBddMin ); printf( "\n" );
        }
        Cudd_RecursiveDeref( dd, bBddDc );
    }

    // start the new network
    pNtkNew = Abc_NtkStartFrom( pNtk, ABC_NTK_LOGIC, ABC_FUNC_BDD );
    // make sure the new manager has the same number of inputs
    Cudd_bddIthVar( (DdManager *)pNtkNew->pManFunc, dd->size-1 );
    // process the POs
    pProgress = Extra_ProgressBarStart( stdout, Abc_NtkCoNum(pNtk) );
    Abc_NtkForEachCo( pNtk, pNode, i )
    {
        Extra_ProgressBarUpdate( pProgress, i, NULL );
        pDriver = Abc_ObjFanin0(pNode);
        if ( Abc_ObjIsCi(pDriver) && !strcmp(Abc_ObjName(pNode), Abc_ObjName(pDriver)) )
        {
            Abc_ObjAddFanin( pNode->pCopy, pDriver->pCopy );
            continue;
        }
        pNodeNew = Abc_NodeFromGlobalBdds( pNtkNew, dd, (DdNode *)Abc_ObjGlobalBdd(pNode), fReverse );
        Abc_ObjAddFanin( pNode->pCopy, pNodeNew );

    }
    Extra_ProgressBarStop( pProgress );
    return pNtkNew;
}